

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::e_formatter<spdlog::details::scoped_padder>::format
          (e_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  scoped_padder p;
  scoped_padder sStack_38;
  
  lVar1 = (msg->time).__d.__r;
  auVar2 = SEXT816(lVar1) * SEXT816(0x112e0be826d694b3);
  auVar3 = SEXT816(lVar1) * SEXT816(0x431bde82d7b634db);
  scoped_padder::scoped_padder(&sStack_38,3,&(this->super_flag_formatter).padinfo_,dest);
  fmt_helper::pad3<unsigned_int>
            (((int)(auVar2._8_8_ >> 0x1a) - (auVar2._12_4_ >> 0x1f)) * -1000 +
             ((int)(auVar3._8_8_ >> 0x12) - (auVar3._12_4_ >> 0x1f)),dest);
  scoped_padder::~scoped_padder(&sStack_38);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto millis = fmt_helper::time_fraction<std::chrono::milliseconds>(msg.time);
        const size_t field_size = 3;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad3(static_cast<uint32_t>(millis.count()), dest);
    }